

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devextra.c
# Opt level: O3

char * get_char_color(CHAR_DATA *ch,char *event)

{
  CHAR_DATA *pCVar1;
  bool bVar2;
  int iVar3;
  int i;
  ulong uVar4;
  long lVar5;
  color_event_type *pcVar6;
  char *pcVar7;
  
  pcVar6 = color_event;
  uVar4 = 0;
  do {
    bVar2 = str_cmp(event,pcVar6->event_name);
    if (!bVar2) goto LAB_002d237f;
    uVar4 = uVar4 + 1;
    pcVar6 = pcVar6 + 1;
  } while (uVar4 != 0xd);
  uVar4 = 0xffffffff;
LAB_002d237f:
  if ((ch->comm[0] & 0x40000000) == 0) {
    if ((ch->desc != (DESCRIPTOR_DATA *)0x0) &&
       (pCVar1 = ch->desc->original, pCVar1 != (CHAR_DATA *)0x0)) {
      ch = pCVar1;
    }
    bVar2 = is_npc(ch);
    pcVar7 = "";
    if ((!bVar2) && ((ch->comm[0] & 0x400) != 0)) {
      if (-1 < (int)uVar4) {
        pcVar7 = color_name_to_ascii(ch->pcdata->color_scheme[uVar4 & 0xffffffff]);
        return pcVar7;
      }
      lVar5 = 0;
      do {
        bVar2 = str_cmp(event,*(char **)((long)&color_table[0].color_name + lVar5));
        if (!bVar2) {
          return *(char **)((long)&color_table[0].color_ascii + lVar5);
        }
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x100);
    }
  }
  else {
    iVar3 = number_range(0,0xf);
    pcVar7 = color_table[iVar3].color_ascii;
  }
  return pcVar7;
}

Assistant:

char *get_char_color(CHAR_DATA *ch, char *event)
{
	int i = get_event_number(event);

	if (IS_SET(ch->comm, COMM_LOTS_O_COLOR))
		return color_table[number_range(0, MAX_COLORS - 1)].color_ascii;

	if (ch->desc != nullptr && ch->desc->original != nullptr)
		ch = ch->desc->original;

	if (is_npc(ch))
		return "";

	if (!IS_SET(ch->comm, COMM_ANSI))
		return "";

	if (i >= 0)
		return color_name_to_ascii(ch->pcdata->color_scheme[i]);

	for (i = 0; i < MAX_COLORS; i++)
	{
		if (!str_cmp(event, color_table[i].color_name))
			return color_table[i].color_ascii;
	}

	return "";
}